

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ResolveImage
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,Image *img,
          ConversionData *conv_data)

{
  pointer *pppaVar1;
  MapType MVar2;
  uint index;
  iterator __position;
  StreamReader<true,_true> *pSVar3;
  int8_t *__src;
  bool bVar4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  aiTexture *paVar8;
  size_t sVar9;
  long lVar10;
  aiTexel *__dest;
  long *plVar11;
  ulong uVar12;
  size_type *psVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  bool bVar20;
  long lVar21;
  aiString name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  aiMaterial *local_860;
  undefined1 *local_858 [2];
  undefined1 local_848 [16];
  undefined1 local_838 [1028];
  aiString local_434;
  
  pcVar17 = local_434.data + 1;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(pcVar17,0x1b,0x3ff);
  if ((img->packedfile).super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    sVar9 = strlen(img->name);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_880,img->name,img->name + sVar9);
    _Var5._M_p = local_880._M_dataplus._M_p;
    sVar9 = 0x3ff;
    if ((local_880._M_string_length & 0xfffffc00) == 0) {
      sVar9 = local_880._M_string_length & 0xffffffff;
    }
    local_838._0_4_ = (uint)sVar9;
    memcpy(local_838 + 4,local_880._M_dataplus._M_p,sVar9);
    local_838[sVar9 + 4] = 0;
    local_434.length = (uint)sVar9;
    memcpy(local_434.data,local_838 + 4,sVar9);
    local_434.data[sVar9] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &local_880.field_2) {
      operator_delete(_Var5._M_p);
    }
  }
  else {
    local_434.data[0] = '*';
    uVar12 = (ulong)((long)(conv_data->textures).arr.
                           super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(conv_data->textures).arr.
                          super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
    local_434.length = 1;
    if ((int)uVar12 < 0) {
      pcVar17 = local_434.data + 2;
      local_434.data[1] = '-';
      uVar12 = (ulong)(uint)-(int)uVar12;
      local_434.length = 2;
    }
    iVar7 = 1000000000;
    bVar20 = false;
    do {
      if (0x3fe < local_434.length) break;
      uVar14 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
      lVar21 = (long)uVar14 / (long)iVar7;
      uVar14 = (long)uVar14 % (long)iVar7 & 0xffffffff;
      if (((bVar20) || (iVar7 == 1)) || ((int)lVar21 != 0)) {
        pcVar19 = pcVar17 + 1;
        local_434.length = local_434.length + 1;
        *pcVar17 = (char)lVar21 + '0';
        bVar20 = true;
        if (iVar7 != 1) goto LAB_004aa560;
        bVar4 = false;
        iVar7 = 1;
        uVar12 = uVar14;
        pcVar17 = pcVar19;
      }
      else {
        uVar14 = uVar12 & 0xffffffff;
        pcVar19 = pcVar17;
LAB_004aa560:
        iVar7 = iVar7 / 10;
        bVar4 = true;
        uVar12 = uVar14;
        pcVar17 = pcVar19;
      }
    } while (bVar4);
    *pcVar17 = '\0';
    paVar8 = (aiTexture *)operator_new(0x428);
    paVar8->mWidth = 0;
    paVar8->mHeight = 0;
    paVar8->pcData = (aiTexel *)0x0;
    (paVar8->mFilename).length = 0;
    (paVar8->mFilename).data[0] = '\0';
    memset((paVar8->mFilename).data + 1,0x1b,0x3ff);
    paVar8->achFormatHint[0] = '\0';
    paVar8->achFormatHint[1] = '\0';
    paVar8->achFormatHint[2] = '\0';
    paVar8->achFormatHint[3] = '\0';
    __position._M_current =
         (conv_data->textures).arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_860 = out;
    local_838._0_8_ = paVar8;
    if (__position._M_current ==
        (conv_data->textures).arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*>
                ((vector<aiTexture*,std::allocator<aiTexture*>> *)&conv_data->textures,__position,
                 (aiTexture **)local_838);
    }
    else {
      *__position._M_current = paVar8;
      pppaVar1 = &(conv_data->textures).arr.
                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    paVar8 = (conv_data->textures).arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    pcVar17 = img->name;
    sVar9 = strlen(pcVar17);
    pcVar15 = img->name + sVar9;
    pcVar19 = pcVar15;
    if (-1 < (long)sVar9) {
      lVar21 = 0x428;
      if ((long)(sVar9 + 0x428) < 0x428) {
        lVar21 = sVar9 + 0x428;
      }
      lVar10 = sVar9 + 0x429;
      pcVar18 = pcVar15;
      do {
        pcVar19 = pcVar18;
        if (*pcVar18 == '.') break;
        pcVar18 = pcVar18 + -1;
        lVar10 = lVar10 + -1;
        pcVar19 = (img->id).name + lVar21 + -0x21;
      } while (0x428 < lVar10);
    }
    if (pcVar15 < pcVar19 + 1) {
      cVar6 = '\0';
    }
    else {
      iVar7 = tolower((int)pcVar19[1]);
      cVar6 = (char)iVar7;
    }
    paVar8->achFormatHint[0] = cVar6;
    if (pcVar15 < pcVar19 + 2) {
      cVar6 = '\0';
    }
    else {
      iVar7 = tolower((int)pcVar19[2]);
      cVar6 = (char)iVar7;
    }
    paVar8->achFormatHint[1] = cVar6;
    if (pcVar15 < pcVar19 + 3) {
      cVar6 = '\0';
    }
    else {
      iVar7 = tolower((int)pcVar19[3]);
      cVar6 = (char)iVar7;
    }
    paVar8->achFormatHint[2] = cVar6;
    paVar8->achFormatHint[3] = '\0';
    uVar16 = ((img->packedfile).
              super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             size;
    paVar8->mWidth = uVar16;
    __dest = (aiTexel *)operator_new__((ulong)uVar16);
    pSVar3 = (conv_data->db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    StreamReader<true,_true>::SetPtr
              (pSVar3,pSVar3->buffer +
                      ((((img->packedfile).
                         super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->data).
                       super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->val);
    pSVar3 = (conv_data->db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    uVar16 = paVar8->mWidth;
    __src = pSVar3->current;
    StreamReader<true,_true>::SetPtr(pSVar3,__src + uVar16);
    memcpy(__dest,__src,(ulong)uVar16);
    paVar8->pcData = __dest;
    local_858[0] = local_848;
    sVar9 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_858,pcVar17,pcVar17 + sVar9);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_858,0,(char *)0x0,0x6e1ab1);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_880.field_2._M_allocated_capacity = *psVar13;
      local_880.field_2._8_8_ = plVar11[3];
      local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    }
    else {
      local_880.field_2._M_allocated_capacity = *psVar13;
      local_880._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_880._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_838,
               &local_880);
    LogFunctions<Assimp::BlenderImporter>::LogInfo((format *)local_838);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
    std::ios_base::~ios_base((ios_base *)(local_838 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p);
    }
    out = local_860;
    if (local_858[0] != local_848) {
      operator_delete(local_858[0]);
    }
  }
  MVar2 = tex->mapto;
  uVar16 = 1;
  if ((MVar2 & MapType_COL) == 0) {
    if ((MVar2 & MapType_NORM) == 0) {
      uVar16 = 2;
      if ((((MVar2 & MapType_COLSPEC) == 0) && (uVar16 = 0xb, (MVar2 & MapType_COLMIR) == 0)) &&
         ((uVar16 = 7, (MVar2 & MapType_SPEC) == 0 &&
          ((uVar16 = 4, (MVar2 & MapType_EMIT) == 0 && (uVar16 = 3, (MVar2 >> 0xb & 1) == 0)))))) {
        uVar16 = (uint)((MVar2 >> 0xc & 1) == 0) * 9 + 9;
      }
    }
    else {
      uVar16 = ((((tex->tex).super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->imaflag >> 0xb & 1) != 0) + 5;
      aiMaterial::AddBinaryProperty(out,&tex->norfac,4,"$mat.bumpscaling",0,0,aiPTI_Float);
    }
  }
  index = conv_data->next_texture[uVar16];
  conv_data->next_texture[uVar16] = index + 1;
  aiMaterial::AddProperty(out,&local_434,"$tex.file",uVar16,index);
  return;
}

Assistant:

void BlenderImporter::ResolveImage(aiMaterial* out, const Material* mat, const MTex* tex, const Image* img, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;
    aiString name;

    // check if the file contents are bundled with the BLEND file
    if (img->packedfile) {
        name.data[0] = '*';
        name.length = 1+ ASSIMP_itoa10(name.data+1,static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(conv_data.textures->size()));

        conv_data.textures->push_back(new aiTexture());
        aiTexture* tex = conv_data.textures->back();

        // usually 'img->name' will be the original file name of the embedded textures,
        // so we can extract the file extension from it.
        const size_t nlen = strlen( img->name );
        const char* s = img->name+nlen, *e = s;
        while ( s >= img->name && *s != '.' ) {
            --s;
        }

        tex->achFormatHint[0] = s+1>e ? '\0' : ::tolower( s[1] );
        tex->achFormatHint[1] = s+2>e ? '\0' : ::tolower( s[2] );
        tex->achFormatHint[2] = s+3>e ? '\0' : ::tolower( s[3] );
        tex->achFormatHint[3] = '\0';

        // tex->mHeight = 0;
        tex->mWidth = img->packedfile->size;
        uint8_t* ch = new uint8_t[tex->mWidth];

        conv_data.db.reader->SetCurrentPos(static_cast<size_t>( img->packedfile->data->val));
        conv_data.db.reader->CopyAndAdvance(ch,tex->mWidth);

        tex->pcData = reinterpret_cast<aiTexel*>(ch);

        LogInfo("Reading embedded texture, original file was "+std::string(img->name));
    } else {
        name = aiString( img->name );
    }

    aiTextureType texture_type = aiTextureType_UNKNOWN;
    MTex::MapType map_type = tex->mapto;

    if (map_type & MTex::MapType_COL)
        texture_type = aiTextureType_DIFFUSE;
    else if (map_type & MTex::MapType_NORM) {
        if (tex->tex->imaflag & Tex::ImageFlags_NORMALMAP) {
            texture_type = aiTextureType_NORMALS;
        }
        else {
            texture_type = aiTextureType_HEIGHT;
        }
        out->AddProperty(&tex->norfac,1,AI_MATKEY_BUMPSCALING);
    }
    else if (map_type & MTex::MapType_COLSPEC)
        texture_type = aiTextureType_SPECULAR;
    else if (map_type & MTex::MapType_COLMIR)
        texture_type = aiTextureType_REFLECTION;
    //else if (map_type & MTex::MapType_REF)
    else if (map_type & MTex::MapType_SPEC)
        texture_type = aiTextureType_SHININESS;
    else if (map_type & MTex::MapType_EMIT)
        texture_type = aiTextureType_EMISSIVE;
    //else if (map_type & MTex::MapType_ALPHA)
    //else if (map_type & MTex::MapType_HAR)
    //else if (map_type & MTex::MapType_RAYMIRR)
    //else if (map_type & MTex::MapType_TRANSLU)
    else if (map_type & MTex::MapType_AMB)
        texture_type = aiTextureType_AMBIENT;
    else if (map_type & MTex::MapType_DISPLACE)
        texture_type = aiTextureType_DISPLACEMENT;
    //else if (map_type & MTex::MapType_WARP)

    out->AddProperty(&name,AI_MATKEY_TEXTURE(texture_type,
        conv_data.next_texture[texture_type]++));

}